

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockNamedValueHandlerRepository_installMultipleCopiers_Test::
~TEST_MockNamedValueHandlerRepository_installMultipleCopiers_Test
          (TEST_MockNamedValueHandlerRepository_installMultipleCopiers_Test *this)

{
  TEST_MockNamedValueHandlerRepository_installMultipleCopiers_Test *this_local;
  
  ~TEST_MockNamedValueHandlerRepository_installMultipleCopiers_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockNamedValueHandlerRepository, installMultipleCopiers)
{
    TypeForTestingExpectedFunctionCallCopier copier1, copier2, copier3;
    MockNamedValueComparatorsAndCopiersRepository repository;
    repository.installCopier("type1", copier1);
    repository.installCopier("type2", copier2);
    repository.installCopier("type3", copier3);
    POINTERS_EQUAL(&copier3, repository.getCopierForType("type3"));
    POINTERS_EQUAL(&copier2, repository.getCopierForType("type2"));
    POINTERS_EQUAL(&copier1, repository.getCopierForType("type1"));
}